

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O0

void __thiscall
cmScriptGenerator::GenerateScriptActionsPerConfig
          (cmScriptGenerator *this,ostream *os,Indent *indent)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  ostream *poVar4;
  int local_ec;
  int local_e8;
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string config_test;
  allocator local_61;
  string local_60;
  char *local_40;
  char *config;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  const_iterator i;
  bool first;
  Indent *indent_local;
  ostream *os_local;
  cmScriptGenerator *this_local;
  
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this->ConfigurationTypes);
  if (bVar1) {
    GenerateScriptActionsOnce(this,os,indent);
  }
  else {
    i._M_current._7_1_ = 1;
    local_30._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(this->ConfigurationTypes);
    while( true ) {
      config = (char *)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(this->ConfigurationTypes);
      bVar1 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&config);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_30);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      local_40 = pcVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_60,pcVar3,&local_61);
      bVar1 = GeneratesForConfig(this,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      pcVar3 = local_40;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b8,pcVar3,&local_b9);
        CreateConfigTest((string *)local_98,this,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        poVar4 = ::operator<<(os,indent);
        pcVar3 = "elseif(";
        if ((i._M_current._7_1_ & 1) != 0) {
          pcVar3 = "if(";
        }
        poVar4 = std::operator<<(poVar4,pcVar3);
        poVar4 = std::operator<<(poVar4,(string *)local_98);
        std::operator<<(poVar4,")\n");
        pcVar3 = local_40;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e0,pcVar3,&local_e1);
        local_e8 = (int)cmScriptGeneratorIndent::Next(indent,2);
        (*this->_vptr_cmScriptGenerator[5])(this,os,local_e0,&local_e8);
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        i._M_current._7_1_ = 0;
        std::__cxx11::string::~string((string *)local_98);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_30);
    }
    if ((i._M_current._7_1_ & 1) == 0) {
      uVar2 = (*this->_vptr_cmScriptGenerator[7])();
      if ((uVar2 & 1) != 0) {
        poVar4 = ::operator<<(os,indent);
        std::operator<<(poVar4,"else()\n");
        local_ec = (int)cmScriptGeneratorIndent::Next(indent,2);
        (*this->_vptr_cmScriptGenerator[6])(this,os,&local_ec);
      }
      poVar4 = ::operator<<(os,indent);
      std::operator<<(poVar4,"endif()\n");
    }
  }
  return;
}

Assistant:

void cmScriptGenerator::GenerateScriptActionsPerConfig(std::ostream& os,
                                                       Indent const& indent)
{
  if(this->ConfigurationTypes->empty())
    {
    // In a single-configuration generator there is only one action
    // and it applies if the runtime-requested configuration is among
    // the rule's allowed configurations.  The configuration built in
    // the tree does not matter for this decision but will be used to
    // generate proper target file names into the code.
    this->GenerateScriptActionsOnce(os, indent);
    }
  else
    {
    // In a multi-configuration generator we produce a separate rule
    // in a block for each configuration that is built.  We restrict
    // the list of configurations to those to which this rule applies.
    bool first = true;
    for(std::vector<std::string>::const_iterator i =
          this->ConfigurationTypes->begin();
        i != this->ConfigurationTypes->end(); ++i)
      {
      const char* config = i->c_str();
      if(this->GeneratesForConfig(config))
        {
        // Generate a per-configuration block.
        std::string config_test = this->CreateConfigTest(config);
        os << indent << (first? "if(" : "elseif(") << config_test << ")\n";
        this->GenerateScriptForConfig(os, config, indent.Next());
        first = false;
        }
      }
    if(!first)
      {
      if(this->NeedsScriptNoConfig())
        {
        os << indent << "else()\n";
        this->GenerateScriptNoConfig(os, indent.Next());
        }
      os << indent << "endif()\n";
      }
    }
}